

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

int BUFFER_prepend(BUFFER_HANDLE handle1,BUFFER_HANDLE handle2)

{
  LOGGER_LOG p_Var1;
  uchar *__dest;
  size_t local_58;
  LOGGER_LOG l_1;
  uchar *temp;
  LOGGER_LOG l;
  size_t malloc_size;
  BUFFER *b2;
  BUFFER *b1;
  int result;
  BUFFER_HANDLE handle2_local;
  BUFFER_HANDLE handle1_local;
  
  if (((handle1 == (BUFFER_HANDLE)0x0) || (handle2 == (BUFFER_HANDLE)0x0)) || (handle1 == handle2))
  {
    b1._4_4_ = 0x213;
  }
  else if (handle1->buffer == (uchar *)0x0) {
    b1._4_4_ = 0x21c;
  }
  else if (handle2->buffer == (uchar *)0x0) {
    b1._4_4_ = 0x221;
  }
  else {
    if (handle1->size < -handle2->size - 1) {
      local_58 = handle1->size + handle2->size;
    }
    else {
      local_58 = 0xffffffffffffffff;
    }
    if (handle2->size == 0) {
      b1._4_4_ = 0;
    }
    else if (local_58 == 0xffffffffffffffff) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/buffer.c"
                  ,"BUFFER_prepend",0x22e,1,"Failure: size_t overflow.");
      }
      b1._4_4_ = 0x22f;
    }
    else {
      __dest = (uchar *)malloc(local_58);
      if (__dest == (uchar *)0x0) {
        p_Var1 = xlogging_get_log_function();
        if (p_Var1 != (LOGGER_LOG)0x0) {
          (*p_Var1)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/buffer.c"
                    ,"BUFFER_prepend",0x238,1,"Failure: allocating temp buffer.");
        }
        b1._4_4_ = 0x239;
      }
      else {
        memcpy(__dest,handle2->buffer,handle2->size);
        memcpy(__dest + handle2->size,handle1->buffer,handle1->size);
        free(handle1->buffer);
        handle1->buffer = __dest;
        handle1->size = handle2->size + handle1->size;
        b1._4_4_ = 0;
      }
    }
  }
  return b1._4_4_;
}

Assistant:

int BUFFER_prepend(BUFFER_HANDLE handle1, BUFFER_HANDLE handle2)
{
    int result;
    if ((handle1 == NULL) || (handle2 == NULL) || (handle1 == handle2))
    {
        /* Codes_SRS_BUFFER_01_005: [ BUFFER_prepend shall return a non-zero upon value any error that is encountered. ]*/
        result = MU_FAILURE;
    }
    else
    {
        BUFFER* b1 = (BUFFER*)handle1;
        BUFFER* b2 = (BUFFER*)handle2;
        if (b1->buffer == NULL)
        {
            /* Codes_SRS_BUFFER_01_005: [ BUFFER_prepend shall return a non-zero upon value any error that is encountered. ]*/
            result = MU_FAILURE;
        }
        else if (b2->buffer == NULL)
        {
            /* Codes_SRS_BUFFER_01_005: [ BUFFER_prepend shall return a non-zero upon value any error that is encountered. ]*/
            result = MU_FAILURE;
        }
        else
        {
            //put b2 ahead of b1: [b2][b1], return b1
            size_t malloc_size = safe_add_size_t(b1->size, b2->size);
            if (b2->size == 0)
            {
                // do nothing
                result = 0;
            }
            else if (malloc_size == SIZE_MAX)
            {
                LogError("Failure: size_t overflow.");
                result = MU_FAILURE;
            }
            else
            {
                // b2->size != 0
                unsigned char* temp = (unsigned char*)malloc(malloc_size);
                if (temp == NULL)
                {
                    /* Codes_SRS_BUFFER_01_005: [ BUFFER_prepend shall return a non-zero upon value any error that is encountered. ]*/
                    LogError("Failure: allocating temp buffer.");
                    result = MU_FAILURE;
                }
                else
                {
                    /* Codes_SRS_BUFFER_01_004: [ BUFFER_prepend concatenates handle1 onto handle2 without modifying handle1 and shall return zero on success. ]*/
                    // Append the BUFFER
#ifdef _MSC_VER
#pragma warning(disable:6386) // Buffer overrun while writing to 'temp'
#endif
                    (void)memcpy(temp, b2->buffer, b2->size);
                    // start from b1->size to append b1
                    (void)memcpy(&temp[b2->size], b1->buffer, b1->size);
#ifdef _MSC_VER
#pragma warning (default:6386)
#endif
                    free(b1->buffer);
                    b1->buffer = temp;
                    b1->size += b2->size;
                    result = 0;
                }
            }
        }
    }
    return result;
}